

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestConsole::Run(SubprocessTestConsole *this)

{
  Test *this_00;
  bool bVar1;
  int iVar2;
  ExitStatus EVar3;
  Subprocess *pSVar4;
  allocator<char> local_39;
  string local_38;
  Subprocess *local_18;
  Subprocess *subproc;
  SubprocessTestConsole *this_local;
  
  subproc = (Subprocess *)this;
  iVar2 = isatty(0);
  if (((iVar2 != 0) && (iVar2 = isatty(1), iVar2 != 0)) && (iVar2 = isatty(2), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"test -t 0 -a -t 1 -a -t 2",&local_39);
    pSVar4 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    local_18 = pSVar4;
    bVar1 = testing::Test::Check
                      (g_current_test,pSVar4 != (Subprocess *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                       ,0x9a,"(Subprocess*)0 != subproc");
    if (bVar1) {
      while (bVar1 = Subprocess::Done(local_18), this_00 = g_current_test,
            ((bVar1 ^ 0xffU) & 1) != 0) {
        SubprocessSet::DoWork(&(this->super_SubprocessTest).subprocs_);
      }
      EVar3 = Subprocess::Finish(local_18);
      testing::Test::Check
                (this_00,EVar3 == ExitSuccess,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                 ,0xa0,"ExitSuccess == subproc->Finish()");
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, Console) {
  // Skip test if we don't have the console ourselves.
  if (isatty(0) && isatty(1) && isatty(2)) {
    Subprocess* subproc =
        subprocs_.Add("test -t 0 -a -t 1 -a -t 2", /*use_console=*/true);
    ASSERT_NE((Subprocess*)0, subproc);

    while (!subproc->Done()) {
      subprocs_.DoWork();
    }

    EXPECT_EQ(ExitSuccess, subproc->Finish());
  }
}